

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::AssignActiveReg(LinearScan *this,Lifetime *lifetime,RegNum reg)

{
  BitVector *pBVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVIndex index;
  undefined7 in_register_00000011;
  ulong uVar6;
  
  index = (BVIndex)CONCAT71(in_register_00000011,reg);
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar6 = 1L << (reg & (RegXMM15|RegXMM14));
  if (((this->activeRegs).word >> ((ulong)reg & 0x3f) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe46,"(!this->activeRegs.Test(reg))","!this->activeRegs.Test(reg)");
    if (!bVar4) goto LAB_005816fb;
    *puVar5 = 0;
  }
  if ((lifetime->field_0x9c & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe47,"(!lifetime->isSpilled)","!lifetime->isSpilled");
    if (!bVar4) goto LAB_005816fb;
    *puVar5 = 0;
  }
  if (lifetime->reg != reg && lifetime->reg != RegNOREG) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe48,"(lifetime->reg == RegNOREG || lifetime->reg == reg)",
                       "lifetime->reg == RegNOREG || lifetime->reg == reg");
    if (!bVar4) {
LAB_005816fb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pFVar2 = this->func;
  BVUnitT<unsigned_long>::AssertRange(index);
  pBVar1 = &pFVar2->m_regsUsed;
  pBVar1->word = pBVar1->word | uVar6;
  lifetime->reg = reg;
  BVUnitT<unsigned_long>::AssertRange(index);
  (this->activeRegs).word = (this->activeRegs).word | uVar6;
  if ((lifetime->field_0x9d & 0x20) == 0) {
    this->intRegUsedCount = this->intRegUsedCount + 1;
  }
  else {
    this->floatRegUsedCount = this->floatRegUsedCount + 1;
  }
  AddToActive(this,lifetime);
  BVUnitT<unsigned_long>::AssertRange(index);
  (this->tempRegs).word = (this->tempRegs).word & ~uVar6;
  return;
}

Assistant:

void
LinearScan::AssignActiveReg(Lifetime * lifetime, RegNum reg)
{
    Assert(!this->activeRegs.Test(reg));
    Assert(!lifetime->isSpilled);
    Assert(lifetime->reg == RegNOREG || lifetime->reg == reg);
    this->func->m_regsUsed.Set(reg);
    lifetime->reg = reg;
    this->activeRegs.Set(reg);
    if (lifetime->IsInt())
    {
        this->intRegUsedCount++;
    }
    else
    {
        this->floatRegUsedCount++;
    }
    this->AddToActive(lifetime);

    this->tempRegs.Clear(reg);
}